

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O3

void __thiscall kratos::FSMVisitor::visit(FSMVisitor *this,Generator *generator)

{
  FSM *this_00;
  _Rb_tree_node_base *p_Var1;
  
  if (generator->is_cloned_ == false) {
    for (p_Var1 = (generator->fsms_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var1 != &(generator->fsms_)._M_t._M_impl.super__Rb_tree_header;
        p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
      this_00 = *(FSM **)(p_Var1 + 2);
      if ((this_00->realized_ == false) && (this_00->parent_fsm_ == (FSM *)0x0)) {
        FSM::realize(this_00);
      }
    }
  }
  return;
}

Assistant:

void visit(Generator* generator) override {
        if (generator->is_cloned()) return;
        for (auto const& iter : generator->fsms()) {
            if (!iter.second->realized() && !iter.second->parent_fsm()) iter.second->realize();
        }
    }